

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatchkit.hpp
# Opt level: O0

void __thiscall
chaiscript::detail::Dispatch_Engine::add_object(Dispatch_Engine *this,string *name,Boxed_Value *obj)

{
  string *in_RDX;
  Dispatch_Engine *in_RSI;
  Stack_Holder *in_stack_ffffffffffffffd8;
  Boxed_Value *in_stack_ffffffffffffffe0;
  
  Boxed_Value::Boxed_Value((Boxed_Value *)in_RSI,(Boxed_Value *)in_RDX);
  get_stack_holder((Dispatch_Engine *)0x256cc6);
  add_object(in_RSI,in_RDX,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  Boxed_Value::~Boxed_Value((Boxed_Value *)0x256cf2);
  return;
}

Assistant:

void add_object(const std::string &name, Boxed_Value obj)
        {
          add_object(name, std::move(obj), get_stack_holder());
        }